

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int __thiscall
CVmObjDate::getp_compareTo(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  vm_obj_id_t vVar4;
  long lVar5;
  
  if (oargc == (uint *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = (long)(int)*oargc;
  }
  if (getp_compareTo(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_compareTo();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_compareTo::desc);
  if (iVar2 != 0) {
    return 1;
  }
  if ((sp_[-1].typ == VM_OBJ) &&
     (iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                     [sp_[-1].val.obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff),
                         metaclass_reg_), iVar2 != 0)) {
    pcVar3 = (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]->ptr_).obj_ +
             (sp_[-1].val.obj & 0xfff) * 0x18;
  }
  else {
    pcVar3 = (char *)0x0;
  }
  if (pcVar3 != (char *)0x0) {
    piVar1 = (int *)(this->super_CVmObject).ext_;
    vVar4 = *piVar1 - **(int **)(pcVar3 + 8);
    if (vVar4 == 0) {
      vVar4 = piVar1[1] - (*(int **)(pcVar3 + 8))[1];
    }
    retval->typ = VM_INT;
    (retval->val).obj = vVar4;
    sp_ = sp_ + -lVar5;
    return 1;
  }
  err_throw(0x900);
}

Assistant:

int CVmObjDate::getp_compareTo(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the other date */
    CVmObjDate *other = vm_val_cast(CVmObjDate, G_stk->get(0));
    if (other == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the respective dates */
    int32_t dayno = get_ext()->dayno;
    int32_t daytime = get_ext()->daytime;
    int32_t odayno = other->get_ext()->dayno;
    int32_t odaytime = other->get_ext()->daytime;

    /* do the comparison */
    retval->set_int(dayno != odayno ? dayno - odayno : daytime - odaytime);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}